

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O0

int __thiscall
cmCTestBuildAndTestHandler::RunCMakeAndTest(cmCTestBuildAndTestHandler *this,string *outstring)

{
  pointer *resultingConfig_00;
  pointer *this_00;
  double dVar1;
  cmCTest *pcVar2;
  undefined8 timeout;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ostream *poVar6;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  reference target;
  size_type sVar9;
  reference pvVar10;
  double dVar11;
  reference ppcVar12;
  bool collapse;
  string local_b30 [32];
  string local_b10 [32];
  undefined1 local_af0 [8];
  ostringstream cmCTestLog_msg_1;
  string local_978 [32];
  vector<const_char_*,_std::allocator<const_char_*>_> local_958;
  int local_93c;
  double dStack_938;
  int runTestRes;
  double remainingTime;
  size_t k_1;
  undefined1 local_920 [4];
  int retval;
  string outs;
  value_type local_8f8;
  ulong local_8f0;
  size_t k;
  undefined1 local_8e0 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> testCommand;
  string local_8a8 [32];
  undefined1 local_888 [8];
  ostringstream cmCTestLog_msg;
  string local_710 [36];
  uint local_6ec;
  undefined1 local_6e8 [4];
  uint i;
  undefined1 local_6c8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed;
  string tempPath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraPaths;
  string resultingConfig;
  string fullPath;
  string local_618 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  allocator local_5d9;
  string local_5d8;
  int local_5b4;
  char *pcStack_5b0;
  int retVal;
  char *config;
  string output;
  double remainingTime_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_578;
  allocator local_569;
  value_type local_568;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_548;
  iterator tarIt;
  undefined1 local_538 [8];
  string cwd;
  double clock_start;
  undefined1 local_4f0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  failed_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraPaths_1;
  string resultingConfig_1;
  string fullPath_1;
  ostringstream out;
  cmCTestBuildAndTestCaptureRAII local_308;
  cmCTestBuildAndTestCaptureRAII captureRAII;
  string cmakeOutString;
  string local_2d8;
  allocator local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  cmake cm;
  string *outstring_local;
  cmCTestBuildAndTestHandler *this_local;
  
  cm.CurrentSnapshot.Position.Position = (PositionType)outstring;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    if (cm.CurrentSnapshot.Position.Position != 0) {
      std::__cxx11::string::operator=
                ((string *)cm.CurrentSnapshot.Position.Position,
                 "--build-and-test requires that the generator be provided using the --build-generator command line option. "
                );
    }
    return 1;
  }
  cmake::cmake((cmake *)local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"",&local_2a1);
  cmake::SetHomeDirectory((cmake *)local_280,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2d8,"",(allocator *)(cmakeOutString.field_2._M_local_buf + 0xf));
  cmake::SetHomeOutputDirectory((cmake *)local_280,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)(cmakeOutString.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&captureRAII);
  cmCTestBuildAndTestCaptureRAII::cmCTestBuildAndTestCaptureRAII
            (&local_308,(cmake *)local_280,(string *)&captureRAII);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(fullPath_1.field_2._M_local_buf + 8))
  ;
  cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  uVar5 = std::__cxx11::string::empty();
  if (((uVar5 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
    std::__cxx11::string::string((string *)(resultingConfig_1.field_2._M_local_buf + 8));
    resultingConfig_00 =
         &extraPaths_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::string((string *)resultingConfig_00);
    this_00 = &failed_1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_4f0);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTestTestHandler::FindExecutable
              ((string *)&clock_start,pcVar2,pcVar7,(string *)resultingConfig_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_4f0);
    std::__cxx11::string::operator=
              ((string *)(resultingConfig_1.field_2._M_local_buf + 8),(string *)&clock_start);
    std::__cxx11::string::~string((string *)&clock_start);
    uVar5 = std::__cxx11::string::empty();
    if (((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::SetConfigType(pcVar2,pcVar7);
    }
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                             "Using config sample with results: ");
    poVar6 = std::operator<<(poVar6,(string *)(resultingConfig_1.field_2._M_local_buf + 8));
    poVar6 = std::operator<<(poVar6," and ");
    poVar6 = std::operator<<(poVar6,(string *)
                                    &extraPaths_1.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_4f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&failed_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &extraPaths_1.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)(resultingConfig_1.field_2._M_local_buf + 8));
  }
  cwd.field_2._8_8_ = cmsys::SystemTools::GetTime();
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_538,(SystemTools *)0x1,collapse);
  poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                           "Internal cmake changing into directory: ");
  poVar6 = std::operator<<(poVar6,(string *)&this->BinaryDir);
  std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  bVar3 = cmsys::SystemTools::FileIsDirectory(&this->BinaryDir);
  if (!bVar3) {
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar7);
  }
  cmsys::SystemTools::ChangeDirectory(&this->BinaryDir);
  if ((this->BuildNoCMake & 1U) == 0) {
    iVar4 = RunCMake(this,(string *)cm.CurrentSnapshot.Position.Position,
                     (ostringstream *)(fullPath_1.field_2._M_local_buf + 8),(string *)&captureRAII,
                     (string *)local_538,(cmake *)local_280);
    if (iVar4 != 0) {
      this_local._4_4_ = 1;
      tarIt._M_current._4_4_ = 1;
      goto LAB_004ca561;
    }
  }
  else {
    pcVar8 = cmake::CreateGlobalGenerator((cmake *)local_280,&this->BuildGenerator);
    cmake::SetGlobalGenerator((cmake *)local_280,pcVar8);
    cmake::SetGeneratorPlatform((cmake *)local_280,&this->BuildGeneratorPlatform);
    cmake::SetGeneratorToolset((cmake *)local_280,&this->BuildGeneratorToolset);
    cmake::LoadCache((cmake *)local_280,&this->BinaryDir);
  }
  __gnu_cxx::
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::__normal_iterator(&local_548);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->BuildTargets);
  if (bVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_568,"",&local_569);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->BuildTargets,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator((allocator<char> *)&local_569);
  }
  local_578 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&this->BuildTargets);
  local_548._M_current = local_578;
  while( true ) {
    remainingTime_1 =
         (double)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->BuildTargets);
    bVar3 = __gnu_cxx::operator!=
                      (&local_548,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&remainingTime_1);
    if (!bVar3) break;
    output.field_2._8_8_ = 0;
    if (0.0 < this->Timeout) {
      dVar1 = this->Timeout;
      dVar11 = cmsys::SystemTools::GetTime();
      output.field_2._8_8_ = (size_type)((dVar1 - dVar11) + cwd.field_2._8_8_);
      if ((double)output.field_2._8_8_ <= 0.0) {
        if (cm.CurrentSnapshot.Position.Position != 0) {
          std::__cxx11::string::operator=
                    ((string *)cm.CurrentSnapshot.Position.Position,
                     "--build-and-test timeout exceeded. ");
        }
        this_local._4_4_ = 1;
        tarIt._M_current._4_4_ = 1;
        goto LAB_004ca561;
      }
    }
    std::__cxx11::string::string((string *)&config);
    pcStack_5b0 = (char *)0x0;
    cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
      pcStack_5b0 = (char *)std::__cxx11::string::c_str();
    }
    if (pcStack_5b0 == (char *)0x0) {
      pcStack_5b0 = "Debug";
    }
    pcVar8 = cmake::GetGlobalGenerator((cmake *)local_280);
    target = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_548);
    pcVar7 = pcStack_5b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5d8,pcVar7,&local_5d9);
    timeout = output.field_2._8_8_;
    bVar3 = this->BuildNoClean;
    local_5f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_5f8);
    iVar4 = cmGlobalGenerator::Build
                      (pcVar8,&this->SourceDir,&this->BinaryDir,&this->BuildProject,target,
                       (string *)&config,&this->BuildMakeProgram,&local_5d8,(bool)(~bVar3 & 1),false
                       ,false,(double)timeout,OUTPUT_NONE,&local_5f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5f8);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
    local_5b4 = iVar4;
    std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),(string *)&config);
    if (local_5b4 == 0) {
      tarIt._M_current._4_4_ = 0;
    }
    else {
      if (cm.CurrentSnapshot.Position.Position != 0) {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)cm.CurrentSnapshot.Position.Position,local_618);
        std::__cxx11::string::~string(local_618);
      }
      this_local._4_4_ = 1;
      tarIt._M_current._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&config);
    if (tarIt._M_current._4_4_ != 0) goto LAB_004ca561;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_548);
  }
  if (cm.CurrentSnapshot.Position.Position != 0) {
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)cm.CurrentSnapshot.Position.Position,
               (string *)(fullPath.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fullPath.field_2._M_local_buf + 8));
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) != 0) {
    this_local._4_4_ = 0;
    tarIt._M_current._4_4_ = 1;
    goto LAB_004ca561;
  }
  std::__cxx11::string::string((string *)(resultingConfig.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &extraPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&tempPath.field_2 + 8));
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)
               &failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)&this->ExecutableDirectory);
    std::__cxx11::string::operator+=
              ((string *)
               &failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"/");
    std::__cxx11::string::operator+=
              ((string *)
               &failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&this->TestCommand);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&tempPath.field_2 + 8),
                (value_type *)
                &failed.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &failed.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_6c8);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTestTestHandler::FindExecutable
            ((string *)local_6e8,pcVar2,pcVar7,
             (string *)
             &extraPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&tempPath.field_2 + 8),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_6c8);
  std::__cxx11::string::operator=
            ((string *)(resultingConfig.field_2._M_local_buf + 8),(string *)local_6e8);
  std::__cxx11::string::~string((string *)local_6e8);
  pcVar7 = (char *)std::__cxx11::string::c_str();
  bVar3 = cmsys::SystemTools::FileExists(pcVar7);
  if (bVar3) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0);
    k = std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0,(value_type *)&k);
    for (local_8f0 = 0; uVar5 = local_8f0,
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->TestCommandArgs), uVar5 < sVar9; local_8f0 = local_8f0 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->TestCommandArgs,local_8f0);
      local_8f8 = (value_type)std::__cxx11::string::c_str();
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0,&local_8f8);
    }
    outs.field_2._8_8_ = 0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0,
               (value_type *)((long)&outs.field_2 + 8));
    std::__cxx11::string::string((string *)local_920);
    k_1._4_4_ = 0;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"Run test in directory: ")
      ;
      poVar6 = std::operator<<(poVar6,(string *)&this->BuildRunDir);
      std::operator<<(poVar6,"\n");
      cmsys::SystemTools::ChangeDirectory(&this->BuildRunDir);
    }
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"Running test command: \"");
    poVar6 = std::operator<<(poVar6,(string *)(resultingConfig.field_2._M_local_buf + 8));
    std::operator<<(poVar6,"\"");
    for (remainingTime = 0.0; dVar1 = remainingTime,
        dVar11 = (double)std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&this->TestCommandArgs), (ulong)dVar1 < (ulong)dVar11;
        remainingTime = (double)((long)remainingTime + 1)) {
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8)," \"");
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->TestCommandArgs,(size_type)remainingTime);
      poVar6 = std::operator<<(poVar6,(string *)pvVar10);
      std::operator<<(poVar6,"\"");
    }
    std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"\n");
    dStack_938 = 0.0;
    if (this->Timeout <= 0.0) {
LAB_004ca1fc:
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                (&local_958,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0);
      iVar4 = cmCTest::RunTest(pcVar2,&local_958,(string *)local_920,(int *)((long)&k_1 + 4),
                               (ostream *)0x0,dStack_938,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)0x0);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_958);
      local_93c = iVar4;
      if ((iVar4 != 4) || (k_1._4_4_ != 0)) {
        poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"Test command failed: ")
        ;
        ppcVar12 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                             ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0,0);
        poVar6 = std::operator<<(poVar6,*ppcVar12);
        std::operator<<(poVar6,"\n");
        k_1._4_4_ = 1;
      }
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),(string *)local_920);
      std::operator<<(poVar6,"\n");
      if (cm.CurrentSnapshot.Position.Position == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_af0);
        std::__cxx11::ostringstream::str();
        poVar6 = std::operator<<((ostream *)local_af0,local_b10);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_b10);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar7 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                     ,0x1b2,pcVar7,false);
        std::__cxx11::string::~string(local_b30);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_af0);
      }
      else {
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)cm.CurrentSnapshot.Position.Position,local_978);
        std::__cxx11::string::~string(local_978);
      }
      this_local._4_4_ = k_1._4_4_;
    }
    else {
      dVar1 = this->Timeout;
      dVar11 = cmsys::SystemTools::GetTime();
      dStack_938 = (dVar1 - dVar11) + (double)cwd.field_2._8_8_;
      if (0.0 < dStack_938) goto LAB_004ca1fc;
      if (cm.CurrentSnapshot.Position.Position != 0) {
        std::__cxx11::string::operator=
                  ((string *)cm.CurrentSnapshot.Position.Position,
                   "--build-and-test timeout exceeded. ");
      }
      this_local._4_4_ = 1;
    }
    tarIt._M_current._4_4_ = 1;
    std::__cxx11::string::~string((string *)local_920);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_8e0);
  }
  else {
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),
                             "Could not find path to executable, perhaps it was not built: ");
    poVar6 = std::operator<<(poVar6,(string *)&this->TestCommand);
    std::operator<<(poVar6,"\n");
    std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),"tried to find it in these places:\n"
                   );
    pcVar7 = (char *)std::__cxx11::string::c_str();
    poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),pcVar7);
    std::operator<<(poVar6,"\n");
    for (local_6ec = 0; uVar5 = (ulong)local_6ec,
        sVar9 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_6c8), uVar5 < sVar9; local_6ec = local_6ec + 1) {
      pvVar10 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_6c8,(ulong)local_6ec);
      poVar6 = std::operator<<((ostream *)((long)&fullPath_1.field_2 + 8),(string *)pvVar10);
      std::operator<<(poVar6,"\n");
    }
    if (cm.CurrentSnapshot.Position.Position == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_888);
      std::__cxx11::ostringstream::str();
      std::operator<<((ostream *)local_888,local_8a8);
      std::__cxx11::string::~string(local_8a8);
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,0x176,pcVar7,false);
      std::__cxx11::string::~string
                ((string *)
                 &testCommand.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_888);
    }
    else {
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)cm.CurrentSnapshot.Position.Position,local_710);
      std::__cxx11::string::~string(local_710);
    }
    cmsys::SystemTools::ChangeDirectory((string *)local_538);
    this_local._4_4_ = 1;
    tarIt._M_current._4_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_6c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&tempPath.field_2 + 8));
  std::__cxx11::string::~string
            ((string *)
             &extraPaths.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(resultingConfig.field_2._M_local_buf + 8));
LAB_004ca561:
  std::__cxx11::string::~string((string *)local_538);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(fullPath_1.field_2._M_local_buf + 8));
  cmCTestBuildAndTestCaptureRAII::~cmCTestBuildAndTestCaptureRAII(&local_308);
  std::__cxx11::string::~string((string *)&captureRAII);
  cmake::~cmake((cmake *)local_280);
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMakeAndTest(std::string* outstring)
{
  // if the generator and make program are not specified then it is an error
  if (this->BuildGenerator.empty())
    {
    if(outstring)
      {
      *outstring =
        "--build-and-test requires that the generator "
        "be provided using the --build-generator "
        "command line option. ";
      }
    return 1;
    }

  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  std::string cmakeOutString;
  cmCTestBuildAndTestCaptureRAII captureRAII(cm, cmakeOutString);
  static_cast<void>(captureRAII);
  std::ostringstream out;

  if ( this->CTest->GetConfigType().empty() &&
       !this->ConfigSample.empty())
    {
    // use the config sample to set the ConfigType
    std::string fullPath;
    std::string resultingConfig;
    std::vector<std::string> extraPaths;
    std::vector<std::string> failed;
    fullPath =
      cmCTestTestHandler::FindExecutable(this->CTest,
                                         this->ConfigSample.c_str(),
                                         resultingConfig,
                                         extraPaths,
                                         failed);
    if (!fullPath.empty() && !resultingConfig.empty())
      {
      this->CTest->SetConfigType(resultingConfig.c_str());
      }
    out << "Using config sample with results: "
        << fullPath << " and " << resultingConfig << std::endl;
    }

  // we need to honor the timeout specified, the timeout include cmake, build
  // and test time
  double clock_start = cmSystemTools::GetTime();

  // make sure the binary dir is there
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  out << "Internal cmake changing into directory: "
    << this->BinaryDir << std::endl;
  if (!cmSystemTools::FileIsDirectory(this->BinaryDir))
    {
    cmSystemTools::MakeDirectory(this->BinaryDir.c_str());
    }
  cmSystemTools::ChangeDirectory(this->BinaryDir);

  if(this->BuildNoCMake)
    {
    // Make the generator available for the Build call below.
    cm.SetGlobalGenerator(cm.CreateGlobalGenerator(
                            this->BuildGenerator));
    cm.SetGeneratorPlatform(this->BuildGeneratorPlatform);
    cm.SetGeneratorToolset(this->BuildGeneratorToolset);

    // Load the cache to make CMAKE_MAKE_PROGRAM available.
    cm.LoadCache(this->BinaryDir);
    }
  else
    {
    // do the cmake step, no timeout here since it is not a sub process
    if (this->RunCMake(outstring,out,cmakeOutString,cwd,&cm))
      {
      return 1;
      }
    }

  // do the build
  std::vector<std::string>::iterator tarIt;
  if (this->BuildTargets.empty())
    {
    this->BuildTargets.push_back("");
    }
  for ( tarIt = this->BuildTargets.begin();
        tarIt != this->BuildTargets.end(); ++ tarIt )
    {
    double remainingTime = 0;
    if (this->Timeout > 0)
      {
      remainingTime = this->Timeout - cmSystemTools::GetTime() + clock_start;
      if (remainingTime <= 0)
        {
        if(outstring)
          {
          *outstring = "--build-and-test timeout exceeded. ";
          }
        return 1;
        }
      }
    std::string output;
    const char* config = 0;
    if (!this->CTest->GetConfigType().empty())
      {
      config = this->CTest->GetConfigType().c_str();
      }
#ifdef CMAKE_INTDIR
    if(!config)
      {
      config = CMAKE_INTDIR;
      }
#endif
    if(!config)
      {
      config = "Debug";
      }
    int retVal = cm.GetGlobalGenerator()->Build(
      this->SourceDir, this->BinaryDir,
      this->BuildProject, *tarIt,
      output, this->BuildMakeProgram,
      config,
      !this->BuildNoClean,
      false, false, remainingTime);
    out << output;
    // if the build failed then return
    if (retVal)
      {
      if(outstring)
        {
        *outstring =  out.str();
        }
      return 1;
      }
    }
  if(outstring)
    {
    *outstring =  out.str();
    }

  // if no test was specified then we are done
  if (this->TestCommand.empty())
    {
    return 0;
    }

  // now run the compiled test if we can find it
  // store the final location in fullPath
  std::string fullPath;
  std::string resultingConfig;
  std::vector<std::string> extraPaths;
  // if this->ExecutableDirectory is set try that as well
  if (!this->ExecutableDirectory.empty())
    {
    std::string tempPath = this->ExecutableDirectory;
    tempPath += "/";
    tempPath += this->TestCommand;
    extraPaths.push_back(tempPath);
    }
  std::vector<std::string> failed;
  fullPath =
    cmCTestTestHandler::FindExecutable(this->CTest,
                                       this->TestCommand.c_str(),
                                       resultingConfig,
                                       extraPaths,
                                       failed);

  if(!cmSystemTools::FileExists(fullPath.c_str()))
    {
    out << "Could not find path to executable, perhaps it was not built: "
      << this->TestCommand << "\n";
    out << "tried to find it in these places:\n";
    out << fullPath.c_str() << "\n";
    for(unsigned int i=0; i < failed.size(); ++i)
      {
      out << failed[i] << "\n";
      }
    if(outstring)
      {
      *outstring =  out.str();
      }
    else
      {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str());
      }
    // return to the original directory
    cmSystemTools::ChangeDirectory(cwd);
    return 1;
    }

  std::vector<const char*> testCommand;
  testCommand.push_back(fullPath.c_str());
  for(size_t k=0; k < this->TestCommandArgs.size(); ++k)
    {
    testCommand.push_back(this->TestCommandArgs[k].c_str());
    }
  testCommand.push_back(0);
  std::string outs;
  int retval = 0;
  // run the test from the this->BuildRunDir if set
  if(!this->BuildRunDir.empty())
    {
    out << "Run test in directory: " << this->BuildRunDir << "\n";
    cmSystemTools::ChangeDirectory(this->BuildRunDir);
    }
  out << "Running test command: \"" << fullPath << "\"";
  for(size_t k=0; k < this->TestCommandArgs.size(); ++k)
    {
    out << " \"" << this->TestCommandArgs[k] << "\"";
    }
  out << "\n";

  // how much time is remaining
  double remainingTime = 0;
  if (this->Timeout > 0)
    {
    remainingTime = this->Timeout - cmSystemTools::GetTime() + clock_start;
    if (remainingTime <= 0)
      {
      if(outstring)
        {
        *outstring = "--build-and-test timeout exceeded. ";
        }
      return 1;
      }
    }

  int runTestRes = this->CTest->RunTest(testCommand, &outs, &retval, 0,
                                        remainingTime, 0);

  if(runTestRes != cmsysProcess_State_Exited || retval != 0)
    {
    out << "Test command failed: " << testCommand[0] << "\n";
    retval = 1;
    }

  out << outs << "\n";
  if(outstring)
    {
    *outstring = out.str();
    }
  else
    {
    cmCTestLog(this->CTest, OUTPUT, out.str() << std::endl);
    }
  return retval;
}